

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O2

void __thiscall SkipList::SkipList(SkipList *this)

{
  pointer ppEVar1;
  Element **i;
  pointer ppEVar2;
  
  this->MAX_HEIGHT = 0x10;
  this->INF = 0x7fffffff;
  Element::Element(&this->head,0,0x10);
  Element::Element(&this->tail,this->INF,0);
  this->height = 0;
  ppEVar1 = (this->head).next.
            super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppEVar2 = (this->head).next.
                 super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppEVar2 != ppEVar1; ppEVar2 = ppEVar2 + 1
      ) {
    *ppEVar2 = &this->tail;
  }
  return;
}

Assistant:

SkipList::SkipList() : head(0, MAX_HEIGHT), tail(INF, 0), height(0) {
    for (auto &i : head.next) {
        i = &tail;
    }
}